

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

vm_obj_id_t __thiscall CVmObjLookupTable::create_copy(CVmObjLookupTable *this)

{
  vm_obj_id_t vVar1;
  uint uVar2;
  CVmObjLookupTable *this_00;
  vm_lookup_ext *pvVar3;
  CVmObjLookupTable *in_RDI;
  vm_lookup_ext *in_stack_00000008;
  vm_lookup_ext *in_stack_00000010;
  CVmObjLookupTable *new_obj;
  vm_obj_id_t id;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  CVmObjLookupTable *pCVar4;
  undefined4 in_stack_ffffffffffffffd0;
  
  vVar1 = vm_new_id((int)(in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  this_00 = (CVmObjLookupTable *)
            CVmObject::operator_new(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  CVmObjLookupTable(this_00);
  pCVar4 = this_00;
  uVar2 = get_bucket_count((CVmObjLookupTable *)0x314c6e);
  get_entry_count((CVmObjLookupTable *)0x314c7c);
  pvVar3 = vm_lookup_ext::alloc_ext
                     ((CVmObjLookupTable *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                      (uint)((ulong)pCVar4 >> 0x20),(uint)pCVar4);
  (this_00->super_CVmObjCollection).super_CVmObject.ext_ = (char *)pvVar3;
  get_ext(this_00);
  get_ext(in_RDI);
  vm_lookup_ext::copy_ext_from(in_stack_00000010,in_stack_00000008);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjLookupTable::create_copy(VMG0_)
{
    vm_obj_id_t id;
    CVmObjLookupTable *new_obj;
    
    /* allocate the object ID */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* allocate a new object */
    new_obj = new (vmg_ id) CVmObjLookupTable();

    /* 
     *   set up the new object with our same sizes, but don't initialize it
     *   - we're going to blast all of our data directly into the new
     *   extension, so we don't need to waste time setting up an empty
     *   initial state 
     */
    new_obj->ext_ = (char *)vm_lookup_ext::alloc_ext(
        vmg_ new_obj, get_bucket_count(), get_entry_count());

    /* copy my data to the next object */
    new_obj->get_ext()->copy_ext_from(get_ext());

    /* return the new object's id */
    return id;
}